

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall
Assimp::FBXExporter::WriteAnimationCurve
          (FBXExporter *this,StreamWriterLE *outstream,double default_value,
          vector<long,_std::allocator<long>_> *times,vector<float,_std::allocator<float>_> *values,
          int64_t curvenode_uid,string *property_link)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long value;
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int64_t curve_uid;
  Node n;
  allocator_type local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  StreamWriterLE *local_150;
  double local_148;
  vector<int,_std::allocator<int>_> local_140;
  vector<float,_std::allocator<float>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<float,_std::allocator<float>_> local_f8;
  vector<long,_std::allocator<long>_> local_e0;
  long local_c8;
  int64_t local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Node local_a0;
  
  paVar1 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar1;
  local_158 = property_link;
  local_150 = outstream;
  local_148 = default_value;
  local_c0 = curvenode_uid;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"AnimationCurve","");
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.force_has_children = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  value = this->last_uid + 1;
  this->last_uid = value;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_c8 = value;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,FBX::SEPARATOR_abi_cxx11_,DAT_00902668 + FBX::SEPARATOR_abi_cxx11_
            );
  std::__cxx11::string::append((char *)&local_178);
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>(&local_a0,value,&local_178,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Default","");
  FBX::Node::AddChild<double>(&local_a0,&local_198,local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyVer","");
  FBX::Node::AddChild<int>(&local_a0,&local_198,0xfa9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyTime","");
  std::vector<long,_std::allocator<long>_>::vector(&local_e0,times);
  FBX::Node::AddChild<std::vector<long,std::allocator<long>>>(&local_a0,&local_198,&local_e0);
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyValueFloat","");
  std::vector<float,_std::allocator<float>_>::vector(&local_f8,values);
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>(&local_a0,&local_198,&local_f8);
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyAttrFlags","");
  local_b8 = (ulong)local_b8._4_4_ << 0x20;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,&local_199);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>(&local_a0,&local_198,&local_110);
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyAttrDataFloat","");
  local_b8 = 0;
  uStack_b0 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_128,__l_00,(allocator_type *)&local_199)
  ;
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>(&local_a0,&local_198,&local_128);
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"KeyAttrRefCount","");
  local_b8 = CONCAT44(local_b8._4_4_,
                      (int)((ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_01,&local_199);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>(&local_a0,&local_198,&local_140);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  FBX::Node::Dump(&local_a0,local_150,this->binary,1);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string_const&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x6d3a01,(char (*) [3])"OP",&local_c8,&local_c0,local_158);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_a0.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_a0.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p,local_a0.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurve(
    StreamWriterLE& outstream,
    double default_value,
    const std::vector<int64_t>& times,
    const std::vector<float>& values,
    int64_t curvenode_uid,
    const std::string& property_link // "d|X", "d|Y", etc
) {
    FBX::Node n("AnimationCurve");
    int64_t curve_uid = generate_uid();
    n.AddProperties(curve_uid, FBX::SEPARATOR + "AnimCurve", "");
    n.AddChild("Default", default_value);
    n.AddChild("KeyVer", int32_t(4009));
    n.AddChild("KeyTime", times);
    n.AddChild("KeyValueFloat", values);
    // TODO: keyattr flags and data (STUB for now)
    n.AddChild("KeyAttrFlags", std::vector<int32_t>{0});
    n.AddChild("KeyAttrDataFloat", std::vector<float>{0,0,0,0});
    n.AddChild(
        "KeyAttrRefCount",
        std::vector<int32_t>{static_cast<int32_t>(times.size())}
    );
    n.Dump(outstream, binary, 1);
    this->connections.emplace_back(
        "C", "OP", curve_uid, curvenode_uid, property_link
    );
}